

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall cmake::PrintTraceFormatVersion(cmake *this)

{
  TraceFormat TVar1;
  Value *pVVar2;
  cmGeneratedFileStream *pcVar3;
  ostream *poVar4;
  Value *in_RCX;
  allocator<char> local_f9;
  Value local_f8;
  string msg;
  Value version;
  String local_88;
  Value val;
  StreamWriterBuilder builder;
  
  if (this->Trace != true) {
    return;
  }
  msg._M_dataplus._M_p = (pointer)&msg.field_2;
  msg._M_string_length = 0;
  msg.field_2._M_local_buf[0] = '\0';
  TVar1 = this->TraceFormatVar;
  if ((TVar1 == TRACE_UNDEFINED) || (TVar1 == TRACE_HUMAN)) {
    std::__cxx11::string::assign((char *)&msg);
  }
  else {
    if (TVar1 != TRACE_JSON_V1) goto LAB_001debc4;
    Json::Value::Value(&val,nullValue);
    Json::Value::Value(&version,nullValue);
    Json::StreamWriterBuilder::StreamWriterBuilder(&builder);
    Json::Value::Value(&local_f8,"");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"indentation",&local_f9);
    pVVar2 = Json::StreamWriterBuilder::operator[](&builder,&local_88);
    Json::Value::operator=(pVVar2,&local_f8);
    std::__cxx11::string::~string((string *)&local_88);
    Json::Value::~Value(&local_f8);
    Json::Value::Value(&local_f8,1);
    pVVar2 = Json::Value::operator[](&version,"major");
    Json::Value::operator=(pVVar2,&local_f8);
    Json::Value::~Value(&local_f8);
    Json::Value::Value(&local_f8,2);
    pVVar2 = Json::Value::operator[](&version,"minor");
    Json::Value::operator=(pVVar2,&local_f8);
    Json::Value::~Value(&local_f8);
    pVVar2 = Json::Value::operator[](&val,"version");
    Json::Value::operator=(pVVar2,&version);
    Json::writeString_abi_cxx11_((String *)&local_f8,(Json *)&builder,(Factory *)&val,in_RCX);
    std::__cxx11::string::operator=((string *)&msg,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    Json::StreamWriterBuilder::~StreamWriterBuilder(&builder);
    Json::Value::~Value(&version);
    Json::Value::~Value(&val);
  }
  if (msg._M_string_length != 0) {
    pcVar3 = GetTraceFile(this);
    if (((&(pcVar3->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
         [(long)(pcVar3->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                _vptr_basic_ostream[-3]] & 5) == 0) {
      poVar4 = std::operator<<((ostream *)pcVar3,(string *)&msg);
      std::operator<<(poVar4,'\n');
    }
    else {
      cmSystemTools::Message(&msg,(char *)0x0);
    }
  }
LAB_001debc4:
  std::__cxx11::string::~string((string *)&msg);
  return;
}

Assistant:

void cmake::PrintTraceFormatVersion()
{
  if (!this->GetTrace()) {
    return;
  }

  std::string msg;

  switch (this->GetTraceFormat()) {
    case TraceFormat::TRACE_JSON_V1: {
#ifndef CMAKE_BOOTSTRAP
      Json::Value val;
      Json::Value version;
      Json::StreamWriterBuilder builder;
      builder["indentation"] = "";
      version["major"] = 1;
      version["minor"] = 2;
      val["version"] = version;
      msg = Json::writeString(builder, val);
#endif
      break;
    }
    case TraceFormat::TRACE_HUMAN:
      msg = "";
      break;
    case TraceFormat::TRACE_UNDEFINED:
      msg = "INTERNAL ERROR: Trace format is TRACE_UNDEFINED";
      break;
  }

  if (msg.empty()) {
    return;
  }

  auto& f = this->GetTraceFile();
  if (f) {
    f << msg << '\n';
  } else {
    cmSystemTools::Message(msg);
  }
}